

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::valList
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProStringList *varList)

{
  MakefileGenerator *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QString local_b8;
  QString local_98;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.m_data = (storage_type *)0x0;
  QVar1.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar1);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size = local_48;
  QVar2.m_data = (storage_type *)0x5;
  QVar2.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar2);
  local_98.d.d = (Data *)local_58;
  local_98.d.ptr = pcStack_50;
  local_98.d.size = local_48;
  this_00 = (MakefileGenerator *)0x0;
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar3);
  local_b8.d.d = (Data *)local_58;
  local_b8.d.ptr = pcStack_50;
  local_b8.d.size = local_48;
  valGlue(__return_storage_ptr__,this_00,varList,&local_78,&local_98,&local_b8);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valList(const ProStringList &varList) const
{
    return valGlue(varList, "", " \\\n\t\t", "");
}